

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sad_impl_avx2.c
# Opt level: O1

uint aom_sad128x64_avg_avx2
               (uint8_t *src_ptr,int src_stride,uint8_t *ref_ptr,int ref_stride,uint8_t *second_pred
               )

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  undefined1 (*pauVar3) [32];
  undefined1 (*pauVar4) [32];
  long lVar5;
  undefined1 auVar6 [64];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  
  pauVar3 = (undefined1 (*) [32])(src_ptr + 0x20);
  pauVar4 = (undefined1 (*) [32])(ref_ptr + 0x20);
  auVar6 = ZEXT1664((undefined1  [16])0x0);
  lVar5 = 0;
  do {
    auVar8 = vpavgb_avx2(pauVar4[-1],*(undefined1 (*) [32])(second_pred + lVar5));
    auVar2 = vpavgb_avx2(*pauVar4,*(undefined1 (*) [32])(second_pred + lVar5 + 0x20));
    auVar8 = vpsadbw_avx2(auVar8,pauVar3[-1]);
    auVar8 = vpaddd_avx2(auVar6._0_32_,auVar8);
    auVar2 = vpsadbw_avx2(auVar2,*pauVar3);
    auVar8 = vpaddd_avx2(auVar8,auVar2);
    auVar6 = ZEXT3264(auVar8);
    pauVar3 = (undefined1 (*) [32])(*pauVar3 + src_stride);
    pauVar4 = (undefined1 (*) [32])(*pauVar4 + ref_stride);
    lVar5 = lVar5 + 0x80;
  } while ((int)lVar5 != 0x2000);
  pauVar4 = (undefined1 (*) [32])(src_ptr + 0x60);
  pauVar3 = (undefined1 (*) [32])(ref_ptr + 0x60);
  auVar6 = ZEXT1664((undefined1  [16])0x0);
  lVar5 = 0;
  do {
    auVar2 = vpavgb_avx2(pauVar3[-1],*(undefined1 (*) [32])(second_pred + lVar5 + 0x40));
    auVar7 = vpavgb_avx2(*pauVar3,*(undefined1 (*) [32])(second_pred + lVar5 + 0x60));
    auVar2 = vpsadbw_avx2(auVar2,pauVar4[-1]);
    auVar2 = vpaddd_avx2(auVar6._0_32_,auVar2);
    auVar7 = vpsadbw_avx2(auVar7,*pauVar4);
    auVar2 = vpaddd_avx2(auVar2,auVar7);
    auVar6 = ZEXT3264(auVar2);
    pauVar4 = (undefined1 (*) [32])(*pauVar4 + src_stride);
    pauVar3 = (undefined1 (*) [32])(*pauVar3 + ref_stride);
    lVar5 = lVar5 + 0x80;
  } while ((int)lVar5 != 0x2000);
  auVar7 = vpsrldq_avx2(auVar8,8);
  auVar8 = vpaddd_avx2(auVar8,auVar7);
  auVar1 = vpaddd_avx(auVar8._0_16_,auVar8._16_16_);
  auVar8 = vpsrldq_avx2(auVar2,8);
  auVar8 = vpaddd_avx2(auVar2,auVar8);
  auVar1 = vpaddd_avx(auVar8._0_16_,auVar1);
  auVar1 = vpaddd_avx(auVar1,auVar8._16_16_);
  return auVar1._0_4_;
}

Assistant:

unsigned int aom_sad128x64_avg_avx2(const uint8_t *src_ptr, int src_stride,
                                    const uint8_t *ref_ptr, int ref_stride,
                                    const uint8_t *second_pred) {
  unsigned int half_width = 64;
  uint32_t sum = sad_w64_avg_avx2(src_ptr, src_stride, ref_ptr, ref_stride, 64,
                                  second_pred, 128);
  src_ptr += half_width;
  ref_ptr += half_width;
  second_pred += half_width;
  sum += sad_w64_avg_avx2(src_ptr, src_stride, ref_ptr, ref_stride, 64,
                          second_pred, 128);
  return sum;
}